

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O3

void ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,UConverterToUnicodeArgs *pToUArgs,
                      UErrorCode *pErrorCode)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  UConverterSharedData *pUVar6;
  UErrorCode *pUVar7;
  uint uVar8;
  UChar32 UVar9;
  undefined4 uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  byte bVar16;
  uint8_t uVar17;
  int iVar18;
  uint uVar19;
  char *pcVar20;
  UConverter *pUVar21;
  byte bVar22;
  uint uVar23;
  undefined8 in_R10;
  ulong uVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte *pbVar27;
  uint8_t *target;
  UConverter *local_78;
  UErrorCode *local_70;
  UConverterToUnicodeArgs *local_68;
  undefined4 local_5c;
  long local_58;
  UConverter *local_50;
  ushort *local_48;
  uint16_t *local_40;
  UChar *noSource;
  
  local_78 = pToUArgs->converter;
  pbVar25 = (byte *)pToUArgs->source;
  pUVar21 = pFromUArgs->converter;
  target = (uint8_t *)pFromUArgs->target;
  pbVar27 = (byte *)pToUArgs->sourceLimit;
  uVar24 = CONCAT71((int7)((ulong)in_R10 >> 8),local_78->toULength);
  if (local_78->toULength < '\x01') {
    bVar22 = 0;
    uVar15 = 0;
    uVar24 = 0;
  }
  else {
    bVar22 = (byte)local_78->mode;
    uVar15 = local_78->toUnicodeStatus;
  }
  pUVar6 = pUVar21->sharedData;
  iVar18 = (((uint)uVar24 & 0xff) - (int)(char)bVar22) + ((int)pbVar27 - (int)pbVar25);
  if ((0 < iVar18) && (bVar2 = pbVar27[-1], (char)bVar2 < '\0')) {
    if ((iVar18 == 1) || (0xbf < bVar2)) {
      if ((byte)(bVar2 + 0x3e) < 0x2e) {
        pbVar27 = pbVar27 + -1;
      }
    }
    else if (((pbVar27[-2] & 0xf0) == 0xe0) &&
            (((byte)" 000000000000\x1000"[pbVar27[-2] & 0xf] >> (bVar2 >> 5) & 1) != 0)) {
      pbVar27 = pbVar27 + -2;
    }
  }
  uVar8 = *(int *)&pFromUArgs->targetLimit - (int)target;
  local_40 = (pUVar6->mbcs).fromUnicodeTable;
  local_48 = (pUVar6->mbcs).mbcsIndex;
  local_58 = *(long *)((pUVar6->mbcs).sbcsIndex +
                      (ulong)(((byte)pUVar21->options & 0x10) >> 4) * 4 + 0x40);
  uVar5 = (pUVar6->mbcs).asciiRoundtrips;
  bVar2 = (pUVar6->mbcs).unicodeMask;
  pbVar26 = pbVar25;
  local_70 = pErrorCode;
  local_68 = pToUArgs;
  local_50 = pUVar21;
  if (uVar15 == 0) goto LAB_00174c2f;
  if ((int)uVar8 < 1) goto LAB_00174c2f;
  local_78->toUnicodeStatus = 0;
  local_78->toULength = '\0';
  uVar11 = uVar24 & 0xffffffff;
LAB_00174a0d:
  uVar10 = (undefined4)uVar11;
  local_5c._0_1_ = (char)uVar11;
  pbVar26 = pbVar25;
  if ((char)uVar24 < (char)bVar22) {
    uVar11 = uVar24 & 0xff;
    uVar24 = uVar11;
    do {
      bVar16 = (byte)uVar24;
      if (local_68->sourceLimit <= pbVar26) {
        uVar13 = (ulong)(char)local_5c;
        if ((char)local_5c < (char)bVar16) {
          do {
            local_78->toUBytes[uVar13] = pbVar25[uVar13 - uVar11];
            uVar13 = uVar13 + 1;
          } while (uVar13 < uVar24);
          pbVar25 = pbVar25 + (uVar13 - uVar11);
        }
        else {
          pbVar25 = pbVar26 + (uVar13 - uVar24);
        }
        local_78->toUnicodeStatus = uVar15;
        local_78->toULength = bVar16;
        local_78->mode = (int)(char)bVar22;
        local_68->source = (char *)pbVar25;
        pFromUArgs->target = (char *)target;
        return;
      }
      bVar3 = *pbVar26;
      if ((bVar22 < 3) || (1 < bVar16)) {
        bVar16 = (char)bVar3 < -0x40;
      }
      else {
        if (bVar22 == 3) {
          bVar16 = '\x01' << (bVar3 >> 5);
          uVar13 = (ulong)(uVar15 & 0xf);
          pcVar20 = " 000000000000\x1000";
        }
        else {
          bVar16 = (byte)(1 << ((byte)uVar15 & 7));
          uVar13 = (ulong)(bVar3 >> 4);
          pcVar20 = "";
        }
        bVar16 = bVar16 & pcVar20[uVar13];
      }
      if (bVar16 == 0) goto LAB_00174ae7;
      pbVar26 = pbVar26 + 1;
      uVar15 = uVar15 * 0x40 + (uint)bVar3;
      uVar24 = uVar24 + 1;
    } while ((char)uVar24 < (char)bVar22);
  }
  else {
LAB_00174ae7:
    bVar16 = (byte)uVar24;
    if (bVar16 != bVar22) {
      lVar14 = (long)(char)bVar16;
      lVar12 = (long)(char)local_5c;
      if ((char)local_5c < (char)bVar16) {
        do {
          local_78->toUBytes[lVar12] = pbVar26[lVar12 - lVar14];
          lVar12 = lVar12 + 1;
        } while (lVar12 < lVar14);
        lVar12 = lVar12 - lVar14;
      }
      else {
        lVar12 = lVar12 - lVar14;
      }
      local_78->toULength = bVar16;
      local_68->source = (char *)(pbVar26 + lVar12);
      pFromUArgs->target = (char *)target;
      *local_70 = U_ILLEGAL_CHAR_FOUND;
      return;
    }
  }
  uVar15 = uVar15 - utf8_offsets[(char)bVar22];
  if (((char)bVar22 < '\x04') || (uVar23 = 0, (bVar2 & 1) != 0)) {
    uVar23 = *(uint *)(local_40 +
                      (ulong)((uVar15 >> 4 & 0x3f) + (uint)local_40[(int)uVar15 >> 10]) * 2);
  }
  uVar19 = (uint)*(ushort *)(local_58 + (ulong)((uVar23 & 0xffff) << 4 | uVar15 & 0xf) * 2);
  pUVar21 = local_50;
  local_5c = uVar10;
  if (((uVar23 >> (sbyte)(uVar15 & 0xf)) >> 0x10 & 1) != 0) goto LAB_00174b7b;
  if (((local_50->useFallback == '\0') && (0x18ff < uVar15 - 0xe000)) &&
     (0x1ffff < uVar15 - 0xf0000)) goto LAB_00174bcf;
LAB_00174b76:
  if ((short)uVar19 == 0) goto LAB_00174bcf;
LAB_00174b7b:
  uVar17 = (uint8_t)uVar19;
  if (uVar19 < 0x100) {
    *target = uVar17;
    iVar18 = -1;
    target = target + 1;
  }
  else {
    puVar1 = target + 1;
    *target = (uint8_t)(uVar19 >> 8);
    if ((int)uVar8 < 2) {
      pUVar21->charErrorBuffer[0] = uVar17;
      pUVar21->charErrorBufferLength = '\x01';
      *local_70 = U_BUFFER_OVERFLOW_ERROR;
      target = puVar1;
LAB_00174d62:
      local_68->source = (char *)pbVar26;
      pFromUArgs->target = (char *)target;
      return;
    }
    target = target + 2;
    *puVar1 = uVar17;
    iVar18 = -2;
  }
  uVar8 = uVar8 + iVar18;
LAB_00174c2f:
  do {
    if (pbVar27 <= pbVar26) goto LAB_00174c80;
    lVar12 = 0;
    while( true ) {
      if ((int)uVar8 < 1) {
        *local_70 = U_BUFFER_OVERFLOW_ERROR;
        pbVar26 = pbVar26 + lVar12;
        goto LAB_00174d62;
      }
      bVar16 = pbVar26[lVar12];
      uVar15 = (uint)bVar16;
      if ((char)bVar16 < '\0') break;
      if ((uVar5 >> (bVar16 >> 2 & 0x1f) & 1) == 0) {
        uVar19 = (uint)*(ushort *)(local_58 + (ulong)(*local_48 + uVar15) * 2);
        pbVar26 = pbVar26 + lVar12 + 1;
        goto LAB_00174b76;
      }
      puVar1 = target + 1;
      *target = bVar16;
      uVar8 = uVar8 - 1;
      lVar12 = lVar12 + 1;
      target = puVar1;
      if ((long)pbVar27 - (long)pbVar26 == lVar12) {
        pbVar26 = pbVar26 + lVar12;
        goto LAB_00174c80;
      }
    }
    pbVar25 = pbVar26 + lVar12 + 1;
    if (0xdf < bVar16) {
      if (bVar16 < 0xee) {
        if ((((byte)" 000000000000\x1000"[uVar15 & 0xf] >> (*pbVar25 >> 5) & 1) != 0) &&
           (uVar23 = pbVar26[lVar12 + 2] ^ 0x80, (byte)uVar23 < 0x40)) {
          uVar15 = *pbVar25 & 0x3f | (uVar15 & 0xf) << 6;
          pbVar26 = pbVar26 + lVar12 + 3;
          uVar4 = *(ushort *)(local_58 + (ulong)(local_48[uVar15] + uVar23) * 2);
          uVar19 = (uint)uVar4;
          pUVar21 = local_50;
          if (uVar4 == 0) {
            uVar15 = uVar15 << 6 | uVar23;
            goto LAB_00174bcf;
          }
          goto LAB_00174b7b;
        }
      }
      else {
        bVar22 = 0;
        if (0x32 < (byte)(bVar16 + 0x3e)) goto LAB_00174a0b;
      }
LAB_001749f4:
      bVar22 = ((0xdf < bVar16) - (bVar16 < 0xf0)) + 3;
LAB_00174a0b:
      uVar24 = 1;
      uVar11 = 0;
      goto LAB_00174a0d;
    }
    bVar22 = 0;
    if (bVar16 < 0xc2) goto LAB_00174a0b;
    uVar23 = *pbVar25 ^ 0x80;
    if (0x3f < (byte)uVar23) goto LAB_001749f4;
    pbVar26 = pbVar26 + lVar12 + 2;
    uVar4 = *(ushort *)(local_58 + (ulong)(local_48[uVar15 & 0x1f] + uVar23) * 2);
    uVar19 = (uint)uVar4;
    if (uVar4 != 0) goto LAB_00174b7b;
    uVar15 = (uVar15 & 0x1f) << 6 | uVar23;
LAB_00174bcf:
    pUVar7 = local_70;
    noSource = L"";
    UVar9 = _extFromU(pUVar21,(UConverterSharedData *)(pUVar21->sharedData->mbcs).extIndexes,uVar15,
                      &noSource,L"",&target,target + uVar8,(int32_t **)0x0,-1,pFromUArgs->flush,
                      local_70);
    pUVar21 = local_50;
    if (U_ZERO_ERROR < *pUVar7) {
      local_50->fromUChar32 = UVar9;
LAB_00174c80:
      if (((*local_70 < U_ILLEGAL_ARGUMENT_ERROR) && (pUVar21->preFromUFirstCP < 0)) &&
         (pbVar25 = (byte *)local_68->sourceLimit, pbVar26 < pbVar25)) {
        bVar22 = *pbVar26;
        uVar15 = (uint)bVar22;
        local_78->toUBytes[0] = bVar22;
        iVar18 = 1;
        if (((char)bVar22 < '\0') && (iVar18 = 0, (byte)(bVar22 + 0x3e) < 0x33)) {
          iVar18 = ((uint)(0xdf < bVar22) - (uint)(bVar22 < 0xf0)) + 3;
        }
        pbVar27 = pbVar26 + 1;
        lVar12 = 1;
        if (pbVar27 < pbVar25) {
          lVar12 = 1;
          do {
            bVar22 = pbVar26[lVar12];
            local_78->toUBytes[(char)lVar12] = bVar22;
            uVar15 = uVar15 * 0x40 + (uint)bVar22;
            lVar12 = lVar12 + 1;
          } while ((long)pbVar25 - (long)pbVar26 != lVar12);
          pbVar27 = pbVar26 + lVar12;
        }
        local_78->toUnicodeStatus = uVar15;
        local_78->toULength = (int8_t)lVar12;
        local_78->mode = iVar18;
        pbVar26 = pbVar27;
      }
      goto LAB_00174d62;
    }
    if (-1 < local_50->preFromUFirstCP) {
      *local_70 = U_USING_DEFAULT_WARNING;
      goto LAB_00174c80;
    }
    uVar8 = *(int *)&pFromUArgs->targetLimit - (int)target;
  } while( true );
}

Assistant:

static void U_CALLCONV
ucnv_DBCSFromUTF8(UConverterFromUnicodeArgs *pFromUArgs,
                  UConverterToUnicodeArgs *pToUArgs,
                  UErrorCode *pErrorCode) {
    UConverter *utf8, *cnv;
    const uint8_t *source, *sourceLimit;
    uint8_t *target;
    int32_t targetCapacity;

    const uint16_t *table, *mbcsIndex;
    const uint16_t *results;

    int8_t oldToULength, toULength, toULimit;

    UChar32 c;
    uint8_t b, t1, t2;

    uint32_t stage2Entry;
    uint32_t asciiRoundtrips;
    uint16_t value = 0;
    UBool hasSupplementary;

    /* set up the local pointers */
    utf8=pToUArgs->converter;
    cnv=pFromUArgs->converter;
    source=(uint8_t *)pToUArgs->source;
    sourceLimit=(uint8_t *)pToUArgs->sourceLimit;
    target=(uint8_t *)pFromUArgs->target;
    targetCapacity=(int32_t)(pFromUArgs->targetLimit-pFromUArgs->target);

    table=cnv->sharedData->mbcs.fromUnicodeTable;
    mbcsIndex=cnv->sharedData->mbcs.mbcsIndex;
    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        results=(uint16_t *)cnv->sharedData->mbcs.swapLFNLFromUnicodeBytes;
    } else {
        results=(uint16_t *)cnv->sharedData->mbcs.fromUnicodeBytes;
    }
    asciiRoundtrips=cnv->sharedData->mbcs.asciiRoundtrips;

    hasSupplementary=(UBool)(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY);

    /* get the converter state from the UTF-8 UConverter */
    if(utf8->toULength > 0) {
        toULength=oldToULength=utf8->toULength;
        toULimit=(int8_t)utf8->mode;
        c=(UChar32)utf8->toUnicodeStatus;
    } else {
        toULength=oldToULength=toULimit=0;
        c = 0;
    }

    // The conversion loop checks source<sourceLimit only once per 1/2/3-byte character.
    // If the buffer ends with a truncated 2- or 3-byte sequence,
    // then we reduce the sourceLimit to before that,
    // and collect the remaining bytes after the conversion loop.
    {
        // Do not go back into the bytes that will be read for finishing a partial
        // sequence from the previous buffer.
        int32_t length=(int32_t)(sourceLimit-source) - (toULimit-oldToULength);
        if(length>0) {
            uint8_t b1=*(sourceLimit-1);
            if(U8_IS_SINGLE(b1)) {
                // common ASCII character
            } else if(U8_IS_TRAIL(b1) && length>=2) {
                uint8_t b2=*(sourceLimit-2);
                if(0xe0<=b2 && b2<0xf0 && U8_IS_VALID_LEAD3_AND_T1(b2, b1)) {
                    // truncated 3-byte sequence
                    sourceLimit-=2;
                }
            } else if(0xc2<=b1 && b1<0xf0) {
                // truncated 2- or 3-byte sequence
                --sourceLimit;
            }
        }
    }

    if(c!=0 && targetCapacity>0) {
        utf8->toUnicodeStatus=0;
        utf8->toULength=0;
        goto moreBytes;
        /* See note in ucnv_SBCSFromUTF8() about this goto. */
    }

    /* conversion loop */
    while(source<sourceLimit) {
        if(targetCapacity>0) {
            b=*source++;
            if(U8_IS_SINGLE(b)) {
                /* convert ASCII */
                if(IS_ASCII_ROUNDTRIP(b, asciiRoundtrips)) {
                    *target++=b;
                    --targetCapacity;
                    continue;
                } else {
                    value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, 0, b);
                    if(value==0) {
                        c=b;
                        goto unassigned;
                    }
                }
            } else {
                if(b>=0xe0) {
                    if( /* handle U+0800..U+D7FF inline */
                        b<=0xed &&  // do not assume maxFastUChar>0xd7ff
                        U8_IS_VALID_LEAD3_AND_T1(b, t1=source[0]) &&
                        (t2=(uint8_t)(source[1]-0x80)) <= 0x3f
                    ) {
                        c=((b&0xf)<<6)|(t1&0x3f);
                        source+=2;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t2);
                        if(value==0) {
                            c=(c<<6)|t2;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                } else {
                    if( /* handle U+0080..U+07FF inline */
                        b>=0xc2 &&
                        (t1=(uint8_t)(*source-0x80)) <= 0x3f
                    ) {
                        c=b&0x1f;
                        ++source;
                        value=DBCS_RESULT_FROM_UTF8(mbcsIndex, results, c, t1);
                        if(value==0) {
                            c=(c<<6)|t1;
                            goto unassigned;
                        }
                    } else {
                        c=-1;
                    }
                }

                if(c<0) {
                    /* handle "complicated" and error cases, and continuing partial characters */
                    oldToULength=0;
                    toULength=1;
                    toULimit=U8_COUNT_BYTES_NON_ASCII(b);
                    c=b;
moreBytes:
                    while(toULength<toULimit) {
                        /*
                         * The sourceLimit may have been adjusted before the conversion loop
                         * to stop before a truncated sequence.
                         * Here we need to use the real limit in case we have two truncated
                         * sequences at the end.
                         * See ticket #7492.
                         */
                        if(source<(uint8_t *)pToUArgs->sourceLimit) {
                            b=*source;
                            if(icu::UTF8::isValidTrail(c, b, toULength, toULimit)) {
                                ++source;
                                ++toULength;
                                c=(c<<6)+b;
                            } else {
                                break; /* sequence too short, stop with toULength<toULimit */
                            }
                        } else {
                            /* store the partial UTF-8 character, compatible with the regular UTF-8 converter */
                            source-=(toULength-oldToULength);
                            while(oldToULength<toULength) {
                                utf8->toUBytes[oldToULength++]=*source++;
                            }
                            utf8->toUnicodeStatus=c;
                            utf8->toULength=toULength;
                            utf8->mode=toULimit;
                            pToUArgs->source=(char *)source;
                            pFromUArgs->target=(char *)target;
                            return;
                        }
                    }

                    if(toULength==toULimit) {
                        c-=utf8_offsets[toULength];
                        if(toULength<=3) {  /* BMP */
                            stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                        } else {
                            /* supplementary code point */
                            if(!hasSupplementary) {
                                /* BMP-only codepages are stored without stage 1 entries for supplementary code points */
                                stage2Entry=0;
                            } else {
                                stage2Entry=MBCS_STAGE_2_FROM_U(table, c);
                            }
                        }
                    } else {
                        /* error handling: illegal UTF-8 byte sequence */
                        source-=(toULength-oldToULength);
                        while(oldToULength<toULength) {
                            utf8->toUBytes[oldToULength++]=*source++;
                        }
                        utf8->toULength=toULength;
                        pToUArgs->source=(char *)source;
                        pFromUArgs->target=(char *)target;
                        *pErrorCode=U_ILLEGAL_CHAR_FOUND;
                        return;
                    }

                    /* get the bytes and the length for the output */
                    /* MBCS_OUTPUT_2 */
                    value=MBCS_VALUE_2_FROM_STAGE_2(results, stage2Entry, c);

                    /* is this code point assigned, or do we use fallbacks? */
                    if(!(MBCS_FROM_U_IS_ROUNDTRIP(stage2Entry, c) ||
                         (UCNV_FROM_U_USE_FALLBACK(cnv, c) && value!=0))
                    ) {
                        goto unassigned;
                    }
                }
            }

            /* write the output character bytes from value and length */
            /* from the first if in the loop we know that targetCapacity>0 */
            if(value<=0xff) {
                /* this is easy because we know that there is enough space */
                *target++=(uint8_t)value;
                --targetCapacity;
            } else /* length==2 */ {
                *target++=(uint8_t)(value>>8);
                if(2<=targetCapacity) {
                    *target++=(uint8_t)value;
                    targetCapacity-=2;
                } else {
                    cnv->charErrorBuffer[0]=(char)value;
                    cnv->charErrorBufferLength=1;

                    /* target overflow */
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
            continue;

unassigned:
            {
                /*
                 * Try an extension mapping.
                 * Pass in no source because we don't have UTF-16 input.
                 * If we have a partial match on c, we will return and revert
                 * to UTF-8->UTF-16->charset conversion.
                 */
                static const UChar nul=0;
                const UChar *noSource=&nul;
                c=_extFromU(cnv, cnv->sharedData,
                            c, &noSource, noSource,
                            &target, target+targetCapacity,
                            NULL, -1,
                            pFromUArgs->flush,
                            pErrorCode);

                if(U_FAILURE(*pErrorCode)) {
                    /* not mappable or buffer overflow */
                    cnv->fromUChar32=c;
                    break;
                } else if(cnv->preFromUFirstCP>=0) {
                    /*
                     * Partial match, return and revert to pivoting.
                     * In normal from-UTF-16 conversion, we would just continue
                     * but then exit the loop because the extension match would
                     * have consumed the source.
                     */
                    *pErrorCode=U_USING_DEFAULT_WARNING;
                    break;
                } else {
                    /* a mapping was written to the target, continue */

                    /* recalculate the targetCapacity after an extension mapping */
                    targetCapacity=(int32_t)(pFromUArgs->targetLimit-(char *)target);
                    continue;
                }
            }
        } else {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    /*
     * The sourceLimit may have been adjusted before the conversion loop
     * to stop before a truncated sequence.
     * If so, then collect the truncated sequence now.
     */
    if(U_SUCCESS(*pErrorCode) &&
            cnv->preFromUFirstCP<0 &&
            source<(sourceLimit=(uint8_t *)pToUArgs->sourceLimit)) {
        c=utf8->toUBytes[0]=b=*source++;
        toULength=1;
        toULimit=U8_COUNT_BYTES(b);
        while(source<sourceLimit) {
            utf8->toUBytes[toULength++]=b=*source++;
            c=(c<<6)+b;
        }
        utf8->toUnicodeStatus=c;
        utf8->toULength=toULength;
        utf8->mode=toULimit;
    }

    /* write back the updated pointers */
    pToUArgs->source=(char *)source;
    pFromUArgs->target=(char *)target;
}